

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O3

bool google::protobuf::compiler::objectivec::ValidateObjCClassPrefixes
               (vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                *files,Options *generation_options,string *out_error)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  FileDescriptor *pFVar3;
  long lVar4;
  _Base_ptr __n;
  bool bVar5;
  undefined8 __s2;
  undefined8 __n_00;
  bool bVar6;
  int iVar7;
  pointer ppFVar8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var9;
  long *plVar10;
  const_iterator cVar11;
  undefined8 *puVar12;
  _Rb_tree_node_base *p_Var13;
  ostream *poVar14;
  long *plVar15;
  size_type *psVar16;
  ulong *puVar17;
  ulong uVar18;
  Options *pOVar19;
  _Alloc_hider _Var20;
  FileDescriptor *pFVar21;
  bool bVar22;
  string other_package_for_prefix;
  string prefix;
  string package;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  expected_package_prefixes;
  ulong *local_200;
  long local_1f8;
  ulong local_1f0;
  long lStack_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  Options *local_1c0;
  string *local_1b8;
  long *local_1b0;
  long local_1a8;
  long local_1a0;
  long lStack_198;
  long *local_190;
  long local_188;
  long local_180;
  long lStack_178;
  undefined1 local_170 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  long *local_110;
  long local_108;
  long local_100;
  long lStack_f8;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  key_type local_a8;
  size_type local_88;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_1b8 = out_error;
  local_d0 = files;
  iVar7 = std::__cxx11::string::compare((char *)generation_options);
  if (iVar7 == 0) {
    return true;
  }
  local_80._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_80._M_impl.super__Rb_tree_header._M_header;
  local_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1c0 = generation_options;
  local_80._M_impl.super__Rb_tree_header._M_header._M_right =
       local_80._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((generation_options->expected_prefixes_path)._M_string_length != 0) {
    local_170._0_8_ = &PTR__LineConsumer_004d0c58;
    local_170._8_8_ = &local_80;
    bVar6 = ParseSimpleFile(&generation_options->expected_prefixes_path,(LineConsumer *)local_170,
                            local_1b8);
    if (!bVar6) {
LAB_0026fd68:
      bVar6 = false;
      goto LAB_0026fd6e;
    }
  }
  ppFVar8 = (local_d0->
            super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  bVar6 = true;
  if ((local_d0->
      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppFVar8) {
    paVar1 = &local_130.field_2;
    uVar18 = 0;
    pOVar19 = local_1c0;
    do {
      _Var9 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        ((pOVar19->expected_prefixes_suppressions).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (pOVar19->expected_prefixes_suppressions).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,*(undefined8 *)ppFVar8[uVar18]);
      if (_Var9._M_current ==
          (pOVar19->expected_prefixes_suppressions).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pFVar3 = (local_d0->
                 super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_start[uVar18];
        bVar6 = pOVar19->prefixes_must_be_registered;
        bVar22 = pOVar19->require_prefixes;
        uVar2 = *(uint *)(*(long *)(pFVar3 + 0x78) + 0x28);
        local_88 = (pOVar19->expected_prefixes_path)._M_string_length;
        plVar10 = (long *)(*(ulong *)(*(long *)(pFVar3 + 0x78) + 0x60) & 0xfffffffffffffffe);
        local_170._0_8_ = local_170 + 0x10;
        lVar4 = *plVar10;
        std::__cxx11::string::_M_construct<char*>((string *)local_170,lVar4,plVar10[1] + lVar4);
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        lVar4 = **(long **)(pFVar3 + 8);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a8,lVar4,(*(long **)(pFVar3 + 8))[1] + lVar4);
        cVar11 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::find(&local_80,&local_a8);
        __n_00 = local_170._8_8_;
        __s2 = local_170._0_8_;
        if ((_Rb_tree_header *)cVar11._M_node == &local_80._M_impl.super__Rb_tree_header) {
          if ((uVar2 & 8) == 0) {
            pFVar21 = (FileDescriptor *)0x1;
            if (bVar22 == false) goto LAB_0026ee85;
            std::operator+(&local_130,"error: \'",
                           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                            pFVar3);
            plVar10 = (long *)std::__cxx11::string::append((char *)&local_130);
            local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
            psVar16 = (size_type *)(plVar10 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar16) {
              local_1e0.field_2._M_allocated_capacity = *psVar16;
              local_1e0.field_2._8_8_ = plVar10[3];
            }
            else {
              local_1e0.field_2._M_allocated_capacity = *psVar16;
              local_1e0._M_dataplus._M_p = (pointer)*plVar10;
            }
            local_1e0._M_string_length = plVar10[1];
            *plVar10 = (long)psVar16;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e0);
            puVar17 = puVar12 + 2;
            if ((ulong *)*puVar12 == puVar17) {
              local_1f0 = *puVar17;
              lStack_1e8 = puVar12[3];
              local_200 = &local_1f0;
            }
            else {
              local_1f0 = *puVar17;
              local_200 = (ulong *)*puVar12;
            }
            local_1f8 = puVar12[1];
            *puVar12 = puVar17;
            puVar12[1] = 0;
            *(undefined1 *)(puVar12 + 2) = 0;
            std::__cxx11::string::operator=((string *)local_1b8,(string *)&local_200);
            if (local_200 != &local_1f0) {
              operator_delete(local_200);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
              operator_delete(local_1e0._M_dataplus._M_p);
            }
            _Var20._M_p = local_130._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_130._M_dataplus._M_p == paVar1) goto LAB_0026ee82;
LAB_0026fd5a:
            operator_delete(_Var20._M_p);
            goto LAB_0026ee82;
          }
          if ((_Base_ptr)local_170._8_8_ != (_Base_ptr)0x0 && local_88 != 0) {
            local_200 = &local_1f0;
            local_1f8 = 0;
            local_1f0 = local_1f0 & 0xffffffffffffff00;
            bVar22 = true;
            p_Var13 = local_80._M_impl.super__Rb_tree_header._M_header._M_left;
            pFVar21 = pFVar3;
            if ((_Rb_tree_header *)local_80._M_impl.super__Rb_tree_header._M_header._M_left !=
                &local_80._M_impl.super__Rb_tree_header) {
              do {
                pFVar21 = (FileDescriptor *)__s2;
                if ((p_Var13[2]._M_parent == (_Base_ptr)__n_00) &&
                   (iVar7 = bcmp(*(void **)(p_Var13 + 2),(void *)__s2,__n_00), iVar7 == 0)) {
                  std::__cxx11::string::_M_assign((string *)&local_200);
                  bVar22 = local_1f8 == 0;
                  break;
                }
                p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13);
              } while ((_Rb_tree_header *)p_Var13 != &local_80._M_impl.super__Rb_tree_header);
            }
            if (local_a8._M_string_length == 0) {
              if (bVar22) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"protoc:0: warning: File \'",0x19);
                poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,(char *)**(undefined8 **)pFVar3,
                                     (*(undefined8 **)pFVar3)[1]);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\' has no ",9);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14,
                           "package. Consider adding a new package to the proto and adding \'",0x40)
                ;
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,"new.package = ",0xe);
                poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar14,(char *)local_170._0_8_,local_170._8_8_);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14,"\' to the expected prefixes file (",0x21);
                poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar14,(local_1c0->expected_prefixes_path)._M_dataplus._M_p,
                                     (local_1c0->expected_prefixes_path)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,").",2);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"protoc:0: warning: File \'",0x19);
                poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,(char *)**(undefined8 **)pFVar3,
                                     (*(undefined8 **)pFVar3)[1]);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14,"\' has no package ",0x11);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,"and package \'",0xd);
                poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar14,(char *)local_200,local_1f8);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14,"\' already uses \'",0x10);
                poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar14,(char *)local_170._0_8_,local_170._8_8_);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14,"\' as its prefix. Consider either adding a new package ",0x36);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14,
                           "to the proto, or reusing one of the packages already using this ",0x40);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14,"prefix in the expected prefixes file (",0x26);
                poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar14,(local_1c0->expected_prefixes_path)._M_dataplus._M_p,
                                     (local_1c0->expected_prefixes_path)._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,").",2);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
              }
              std::ostream::put((char)poVar14);
              std::ostream::flush();
              std::ostream::flush();
              pFVar21 = (FileDescriptor *)0x1;
LAB_0026f652:
              bVar5 = false;
            }
            else {
              bVar5 = true;
              if (!bVar22) {
                std::operator+(&local_50,"error: Found \'option objc_class_prefix = \"",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_170);
                puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
                local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
                psVar16 = puVar12 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar12 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar16) {
                  local_c8.field_2._M_allocated_capacity = *psVar16;
                  local_c8.field_2._8_8_ = puVar12[3];
                }
                else {
                  local_c8.field_2._M_allocated_capacity = *psVar16;
                  local_c8._M_dataplus._M_p = (pointer)*puVar12;
                }
                local_c8._M_string_length = puVar12[1];
                *puVar12 = psVar16;
                puVar12[1] = 0;
                *(undefined1 *)(puVar12 + 2) = 0;
                plVar10 = (long *)std::__cxx11::string::_M_append
                                            ((char *)&local_c8,**(ulong **)pFVar3);
                local_110 = &local_100;
                plVar15 = plVar10 + 2;
                if ((long *)*plVar10 == plVar15) {
                  local_100 = *plVar15;
                  lStack_f8 = plVar10[3];
                }
                else {
                  local_100 = *plVar15;
                  local_110 = (long *)*plVar10;
                }
                local_108 = plVar10[1];
                *plVar10 = (long)plVar15;
                plVar10[1] = 0;
                *(undefined1 *)(plVar10 + 2) = 0;
                plVar10 = (long *)std::__cxx11::string::append((char *)&local_110);
                local_f0 = &local_e0;
                plVar15 = plVar10 + 2;
                if ((long *)*plVar10 == plVar15) {
                  local_e0 = *plVar15;
                  lStack_d8 = plVar10[3];
                }
                else {
                  local_e0 = *plVar15;
                  local_f0 = (long *)*plVar10;
                }
                local_e8 = plVar10[1];
                *plVar10 = (long)plVar15;
                plVar10[1] = 0;
                *(undefined1 *)(plVar10 + 2) = 0;
                plVar10 = (long *)std::__cxx11::string::_M_append
                                            ((char *)&local_f0,(ulong)local_200);
                local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
                psVar16 = (size_type *)(plVar10 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar10 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar16) {
                  local_150.field_2._M_allocated_capacity = *psVar16;
                  local_150.field_2._8_8_ = plVar10[3];
                }
                else {
                  local_150.field_2._M_allocated_capacity = *psVar16;
                  local_150._M_dataplus._M_p = (pointer)*plVar10;
                }
                local_150._M_string_length = plVar10[1];
                *plVar10 = (long)psVar16;
                plVar10[1] = 0;
                *(undefined1 *)(plVar10 + 2) = 0;
                puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_150);
                local_1b0 = &local_1a0;
                plVar10 = puVar12 + 2;
                if ((long *)*puVar12 == plVar10) {
                  local_1a0 = *plVar10;
                  lStack_198 = puVar12[3];
                }
                else {
                  local_1a0 = *plVar10;
                  local_1b0 = (long *)*puVar12;
                }
                local_1a8 = puVar12[1];
                *puVar12 = plVar10;
                puVar12[1] = 0;
                *(undefined1 *)(puVar12 + 2) = 0;
                puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_1b0);
                local_190 = &local_180;
                plVar10 = puVar12 + 2;
                if ((long *)*puVar12 == plVar10) {
                  local_180 = *plVar10;
                  lStack_178 = puVar12[3];
                }
                else {
                  local_180 = *plVar10;
                  local_190 = (long *)*puVar12;
                }
                local_188 = puVar12[1];
                *puVar12 = plVar10;
                puVar12[1] = 0;
                *(undefined1 *)(puVar12 + 2) = 0;
                puVar12 = (undefined8 *)
                          std::__cxx11::string::_M_append
                                    ((char *)&local_190,
                                     (ulong)(local_1c0->expected_prefixes_path)._M_dataplus._M_p);
                psVar16 = puVar12 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar12 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar16) {
                  local_130.field_2._M_allocated_capacity = *psVar16;
                  local_130.field_2._8_8_ = puVar12[3];
                  local_130._M_dataplus._M_p = (pointer)paVar1;
                }
                else {
                  local_130.field_2._M_allocated_capacity = *psVar16;
                  local_130._M_dataplus._M_p = (pointer)*puVar12;
                }
                local_130._M_string_length = puVar12[1];
                *puVar12 = psVar16;
                puVar12[1] = 0;
                *(undefined1 *)(puVar12 + 2) = 0;
                puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_130);
                psVar16 = puVar12 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar12 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar16) {
                  local_1e0.field_2._M_allocated_capacity = *psVar16;
                  local_1e0.field_2._8_8_ = puVar12[3];
                  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
                }
                else {
                  local_1e0.field_2._M_allocated_capacity = *psVar16;
                  local_1e0._M_dataplus._M_p = (pointer)*puVar12;
                }
                local_1e0._M_string_length = puVar12[1];
                *puVar12 = psVar16;
                puVar12[1] = 0;
                *(undefined1 *)(puVar12 + 2) = 0;
                std::__cxx11::string::operator=((string *)local_1b8,(string *)&local_1e0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                  operator_delete(local_1e0._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_130._M_dataplus._M_p != paVar1) {
                  operator_delete(local_130._M_dataplus._M_p);
                }
                if (local_190 != &local_180) {
                  operator_delete(local_190);
                }
                if (local_1b0 != &local_1a0) {
                  operator_delete(local_1b0);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_150._M_dataplus._M_p != &local_150.field_2) {
                  operator_delete(local_150._M_dataplus._M_p);
                }
                if (local_f0 != &local_e0) {
                  operator_delete(local_f0);
                }
                if (local_110 != &local_100) {
                  operator_delete(local_110);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                  operator_delete(local_c8._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
                  operator_delete(local_50._M_dataplus._M_p);
                }
                pFVar21 = (FileDescriptor *)0x0;
                goto LAB_0026f652;
              }
            }
            if (local_200 != &local_1f0) {
              operator_delete(local_200);
            }
            if (!bVar5) goto LAB_0026ee85;
          }
          if ((_Base_ptr)local_170._8_8_ != (_Base_ptr)0x0) {
            if (0x19 < (byte)((char)*(FileDescriptor *)local_170._0_8_ + 0xbfU)) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "protoc:0: warning: Invalid \'option objc_class_prefix = \"",0x38);
              poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,(char *)local_170._0_8_,local_170._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\";\' in \'",8);
              poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar14,(char *)**(undefined8 **)pFVar3,
                                   (*(undefined8 **)pFVar3)[1]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\';",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar14," it should start with a capital letter.",0x27);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
              std::ostream::put((char)poVar14);
              std::ostream::flush();
              std::ostream::flush();
            }
            if ((undefined1 *)((long)&((_Base_ptr)(local_170._8_8_ + -0x20))->_M_right + 7) <
                (undefined1 *)0x2) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "protoc:0: warning: Invalid \'option objc_class_prefix = \"",0x38);
              poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,(char *)local_170._0_8_,local_170._8_8_);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\";\' in \'",8);
              poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar14,(char *)**(undefined8 **)pFVar3,
                                   (*(undefined8 **)pFVar3)[1]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\';",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar14," Apple recommends they should be at least 3 characters long.",0x3c
                        );
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
              std::ostream::put((char)poVar14);
              std::ostream::flush();
              std::ostream::flush();
            }
          }
          pFVar21 = (FileDescriptor *)0x1;
          if (local_88 != 0) {
            if (bVar6 != false) {
              std::operator+(&local_c8,"error: \'",
                             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                              pFVar3);
              puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_c8);
              local_110 = &local_100;
              plVar10 = puVar12 + 2;
              if ((long *)*puVar12 == plVar10) {
                local_100 = *plVar10;
                lStack_f8 = puVar12[3];
              }
              else {
                local_100 = *plVar10;
                local_110 = (long *)*puVar12;
              }
              local_108 = puVar12[1];
              *puVar12 = plVar10;
              puVar12[1] = 0;
              *(undefined1 *)(puVar12 + 2) = 0;
              puVar12 = (undefined8 *)
                        std::__cxx11::string::_M_append((char *)&local_110,local_170._0_8_);
              local_f0 = &local_e0;
              plVar10 = puVar12 + 2;
              if ((long *)*puVar12 == plVar10) {
                local_e0 = *plVar10;
                lStack_d8 = puVar12[3];
              }
              else {
                local_e0 = *plVar10;
                local_f0 = (long *)*puVar12;
              }
              local_e8 = puVar12[1];
              *puVar12 = plVar10;
              puVar12[1] = 0;
              *(undefined1 *)(puVar12 + 2) = 0;
              puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
              local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
              psVar16 = puVar12 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar12 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar16) {
                local_150.field_2._M_allocated_capacity = *psVar16;
                local_150.field_2._8_8_ = puVar12[3];
              }
              else {
                local_150.field_2._M_allocated_capacity = *psVar16;
                local_150._M_dataplus._M_p = (pointer)*puVar12;
              }
              local_150._M_string_length = puVar12[1];
              *puVar12 = psVar16;
              puVar12[1] = 0;
              *(undefined1 *)(puVar12 + 2) = 0;
              puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_150);
              local_1b0 = &local_1a0;
              plVar10 = puVar12 + 2;
              if ((long *)*puVar12 == plVar10) {
                local_1a0 = *plVar10;
                lStack_198 = puVar12[3];
              }
              else {
                local_1a0 = *plVar10;
                local_1b0 = (long *)*puVar12;
              }
              local_1a8 = puVar12[1];
              *puVar12 = plVar10;
              puVar12[1] = 0;
              *(undefined1 *)(puVar12 + 2) = 0;
              puVar12 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&local_1b0,
                                   (ulong)(local_1c0->expected_prefixes_path)._M_dataplus._M_p);
              local_190 = &local_180;
              plVar10 = puVar12 + 2;
              if ((long *)*puVar12 == plVar10) {
                local_180 = *plVar10;
                lStack_178 = puVar12[3];
              }
              else {
                local_180 = *plVar10;
                local_190 = (long *)*puVar12;
              }
              local_188 = puVar12[1];
              *puVar12 = plVar10;
              puVar12[1] = 0;
              *(undefined1 *)(puVar12 + 2) = 0;
              puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_190);
              psVar16 = puVar12 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar12 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar16) {
                local_130.field_2._M_allocated_capacity = *psVar16;
                local_130.field_2._8_8_ = puVar12[3];
                local_130._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_130.field_2._M_allocated_capacity = *psVar16;
                local_130._M_dataplus._M_p = (pointer)*puVar12;
              }
              local_130._M_string_length = puVar12[1];
              *puVar12 = psVar16;
              puVar12[1] = 0;
              *(undefined1 *)(puVar12 + 2) = 0;
              puVar12 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&local_130,(ulong)local_a8._M_dataplus._M_p);
              local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
              psVar16 = puVar12 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar12 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar16) {
                local_1e0.field_2._M_allocated_capacity = *psVar16;
                local_1e0.field_2._8_8_ = puVar12[3];
              }
              else {
                local_1e0.field_2._M_allocated_capacity = *psVar16;
                local_1e0._M_dataplus._M_p = (pointer)*puVar12;
              }
              local_1e0._M_string_length = puVar12[1];
              *puVar12 = psVar16;
              puVar12[1] = 0;
              *(undefined1 *)(puVar12 + 2) = 0;
              puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e0);
              puVar17 = puVar12 + 2;
              if ((ulong *)*puVar12 == puVar17) {
                local_1f0 = *puVar17;
                lStack_1e8 = puVar12[3];
                local_200 = &local_1f0;
              }
              else {
                local_1f0 = *puVar17;
                local_200 = (ulong *)*puVar12;
              }
              local_1f8 = puVar12[1];
              *puVar12 = puVar17;
              puVar12[1] = 0;
              *(undefined1 *)(puVar12 + 2) = 0;
              std::__cxx11::string::operator=((string *)local_1b8,(string *)&local_200);
              if (local_200 != &local_1f0) {
                operator_delete(local_200);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
                operator_delete(local_1e0._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_130._M_dataplus._M_p != paVar1) {
                operator_delete(local_130._M_dataplus._M_p);
              }
              if (local_190 != &local_180) {
                operator_delete(local_190);
              }
              if (local_1b0 != &local_1a0) {
                operator_delete(local_1b0);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_150._M_dataplus._M_p != &local_150.field_2) {
                operator_delete(local_150._M_dataplus._M_p);
              }
              if (local_f0 != &local_e0) {
                operator_delete(local_f0);
              }
              if (local_110 != &local_100) {
                operator_delete(local_110);
              }
              _Var20._M_p = local_c8._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p == &local_c8.field_2) goto LAB_0026ee82;
              goto LAB_0026fd5a;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,
                       "protoc:0: warning: Found unexpected \'option objc_class_prefix = \"",0x41);
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,(char *)local_170._0_8_,local_170._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\";\' in \'",8);
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar14,(char *)**(undefined8 **)pFVar3,(*(undefined8 **)pFVar3)[1]
                                );
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\';",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14," consider adding it to the expected prefixes file (",0x33);
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar14,(local_1c0->expected_prefixes_path)._M_dataplus._M_p,
                                 (local_1c0->expected_prefixes_path)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,").",2);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
            std::ostream::put((char)poVar14);
            std::ostream::flush();
            std::ostream::flush();
          }
        }
        else {
          if ((((uVar2 & 8) != 0) &&
              (__n = cVar11._M_node[2]._M_parent, __n == (_Base_ptr)local_170._8_8_)) &&
             ((pFVar21 = (FileDescriptor *)0x1, __n == (_Base_ptr)0x0 ||
              (iVar7 = bcmp(*(void **)(cVar11._M_node + 2),(void *)local_170._0_8_,(size_t)__n),
              iVar7 == 0)))) goto LAB_0026ee85;
          std::operator+(&local_150,"error: Expected \'option objc_class_prefix = \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (cVar11._M_node + 2));
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_150);
          local_1b0 = &local_1a0;
          plVar15 = plVar10 + 2;
          if ((long *)*plVar10 == plVar15) {
            local_1a0 = *plVar15;
            lStack_198 = plVar10[3];
          }
          else {
            local_1a0 = *plVar15;
            local_1b0 = (long *)*plVar10;
          }
          local_1a8 = plVar10[1];
          *plVar10 = (long)plVar15;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          plVar10 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_1b0,(ulong)local_a8._M_dataplus._M_p);
          local_190 = &local_180;
          plVar15 = plVar10 + 2;
          if ((long *)*plVar10 == plVar15) {
            local_180 = *plVar15;
            lStack_178 = plVar10[3];
          }
          else {
            local_180 = *plVar15;
            local_190 = (long *)*plVar10;
          }
          local_188 = plVar10[1];
          *plVar10 = (long)plVar15;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_190);
          psVar16 = (size_type *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar16) {
            local_130.field_2._M_allocated_capacity = *psVar16;
            local_130.field_2._8_8_ = plVar10[3];
            local_130._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_130.field_2._M_allocated_capacity = *psVar16;
            local_130._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_130._M_string_length = plVar10[1];
          *plVar10 = (long)psVar16;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          puVar12 = (undefined8 *)
                    std::__cxx11::string::_M_append((char *)&local_130,**(ulong **)pFVar3);
          local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
          psVar16 = puVar12 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar16) {
            local_1e0.field_2._M_allocated_capacity = *psVar16;
            local_1e0.field_2._8_8_ = puVar12[3];
          }
          else {
            local_1e0.field_2._M_allocated_capacity = *psVar16;
            local_1e0._M_dataplus._M_p = (pointer)*puVar12;
          }
          local_1e0._M_string_length = puVar12[1];
          *puVar12 = psVar16;
          puVar12[1] = 0;
          *(undefined1 *)(puVar12 + 2) = 0;
          plVar10 = (long *)std::__cxx11::string::append((char *)&local_1e0);
          puVar17 = (ulong *)(plVar10 + 2);
          if ((ulong *)*plVar10 == puVar17) {
            local_1f0 = *puVar17;
            lStack_1e8 = plVar10[3];
            local_200 = &local_1f0;
          }
          else {
            local_1f0 = *puVar17;
            local_200 = (ulong *)*plVar10;
          }
          local_1f8 = plVar10[1];
          *plVar10 = (long)puVar17;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          std::__cxx11::string::operator=((string *)local_1b8,(string *)&local_200);
          if (local_200 != &local_1f0) {
            operator_delete(local_200);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
            operator_delete(local_1e0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != paVar1) {
            operator_delete(local_130._M_dataplus._M_p);
          }
          if (local_190 != &local_180) {
            operator_delete(local_190);
          }
          if (local_1b0 != &local_1a0) {
            operator_delete(local_1b0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p);
          }
          if ((uVar2 & 8) != 0) {
            std::operator+(&local_1e0,"; but found \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_170);
            puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_1e0);
            local_200 = &local_1f0;
            puVar17 = puVar12 + 2;
            if ((ulong *)*puVar12 == puVar17) {
              local_1f0 = *puVar17;
              lStack_1e8 = puVar12[3];
            }
            else {
              local_1f0 = *puVar17;
              local_200 = (ulong *)*puVar12;
            }
            local_1f8 = puVar12[1];
            *puVar12 = puVar17;
            puVar12[1] = 0;
            *(undefined1 *)(puVar12 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_1b8,(ulong)local_200);
            if (local_200 != &local_1f0) {
              operator_delete(local_200);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
              operator_delete(local_1e0._M_dataplus._M_p);
            }
          }
          std::__cxx11::string::append((char *)local_1b8);
LAB_0026ee82:
          pFVar21 = (FileDescriptor *)0x0;
        }
LAB_0026ee85:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p);
        }
        if ((FileDescriptor *)local_170._0_8_ != (FileDescriptor *)(local_170 + 0x10)) {
          operator_delete((void *)local_170._0_8_);
        }
        pOVar19 = local_1c0;
        if (((ulong)pFVar21 & 1) == 0) goto LAB_0026fd68;
      }
      uVar18 = uVar18 + 1;
      ppFVar8 = (local_d0->
                super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar18 < (ulong)((long)(local_d0->
                                    super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar8 >> 3
                             ));
    bVar6 = true;
  }
LAB_0026fd6e:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_80);
  return bVar6;
}

Assistant:

bool ValidateObjCClassPrefixes(const std::vector<const FileDescriptor*>& files,
                               const Options& generation_options,
                               std::string* out_error) {
  // Allow a '-' as the path for the expected prefixes to completely disable
  // even the most basic of checks.
  if (generation_options.expected_prefixes_path == "-") {
    return true;
  }

  // Load the expected package prefixes, if available, to validate against.
  std::map<std::string, std::string> expected_package_prefixes;
  if (!LoadExpectedPackagePrefixes(generation_options,
                                   &expected_package_prefixes,
                                   out_error)) {
    return false;
  }

  for (int i = 0; i < files.size(); i++) {
    bool should_skip =
      (std::find(generation_options.expected_prefixes_suppressions.begin(),
                 generation_options.expected_prefixes_suppressions.end(),
                 files[i]->name())
          != generation_options.expected_prefixes_suppressions.end());
    if (should_skip) {
      continue;
    }

    bool is_valid =
        ValidateObjCClassPrefix(files[i],
                                generation_options.expected_prefixes_path,
                                expected_package_prefixes,
                                generation_options.prefixes_must_be_registered,
                                generation_options.require_prefixes,
                                out_error);
    if (!is_valid) {
      return false;
    }
  }
  return true;
}